

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

char * nlohmann::detail::dtoa_impl::append_exponent(char *buf,int e)

{
  uint local_14;
  uint32_t k;
  int e_local;
  char *buf_local;
  
  if (e < -999) {
    __assert_fail("e > -1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x23dc,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)");
  }
  if (999 < e) {
    __assert_fail("e < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x23dd,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)");
  }
  if (e < 0) {
    local_14 = -e;
    *buf = '-';
  }
  else {
    *buf = '+';
    local_14 = e;
  }
  _k = buf + 1;
  if (local_14 < 10) {
    *_k = '0';
    _k = buf + 3;
    buf[2] = (char)local_14 + '0';
  }
  else if (local_14 < 100) {
    *_k = (char)((ulong)local_14 / 10) + '0';
    _k = buf + 3;
    buf[2] = (char)(local_14 % 10) + '0';
  }
  else {
    *_k = (char)((ulong)local_14 / 100) + '0';
    buf[2] = (char)((local_14 % 100) / 10) + '0';
    _k = buf + 4;
    buf[3] = (char)((local_14 % 100) % 10) + '0';
  }
  return _k;
}

Assistant:

inline char* append_exponent(char* buf, int e) {
	assert(e > -1000);
	assert(e < 1000);

	if (e < 0) {
		e = -e;
		*buf++ = '-';
	} else {
		*buf++ = '+';
	}

	auto k = static_cast<uint32_t>(e);
	if (k < 10) {
		// Always print at least two digits in the exponent.
		// This is for compatibility with printf("%g").
		*buf++ = '0';
		*buf++ = static_cast<char>('0' + k);
	} else if (k < 100) {
		*buf++ = static_cast<char>('0' + k / 10);
		k %= 10;
		*buf++ = static_cast<char>('0' + k);
	} else {
		*buf++ = static_cast<char>('0' + k / 100);
		k %= 100;
		*buf++ = static_cast<char>('0' + k / 10);
		k %= 10;
		*buf++ = static_cast<char>('0' + k);
	}

	return buf;
}